

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UdpSocket.cpp
# Opt level: O3

void __thiscall SocketReceiveMultiplexer::Implementation::Run(Implementation *this)

{
  uint uVar1;
  Implementation *this_00;
  double dVar2;
  pair<double,_AttachedTimerListener> *ppVar3;
  __time_t _Var4;
  __suseconds_t _Var5;
  int iVar6;
  uint uVar7;
  pointer ppVar8;
  char *data;
  size_t sVar9;
  pointer ppVar10;
  int *piVar11;
  runtime_error *this_01;
  ulong uVar12;
  long lVar13;
  bool bVar14;
  int iVar15;
  ulong *puVar16;
  fd_set *pfVar17;
  timeval *__timeout;
  pair<double,_AttachedTimerListener> *ppVar18;
  pointer pAVar19;
  int iVar20;
  byte bVar21;
  double dVar22;
  vector<std::pair<double,_AttachedTimerListener>,_std::allocator<std::pair<double,_AttachedTimerListener>_>_>
  timerQueue_;
  timeval t_1;
  timeval timeout;
  IpEndpointName remoteEndpoint;
  fd_set tempfds;
  fd_set masterfds;
  timeval local_198;
  pair<double,_AttachedTimerListener> *local_188;
  double local_178;
  pair<double,_AttachedTimerListener> local_170;
  timeval local_158;
  IpEndpointName local_148;
  fd_set local_138;
  ulong local_b8 [17];
  
  bVar21 = 0;
  this->break_ = false;
  local_b8[0xe] = 0;
  local_b8[0xf] = 0;
  local_b8[0xc] = 0;
  local_b8[0xd] = 0;
  local_b8[10] = 0;
  local_b8[0xb] = 0;
  local_b8[8] = 0;
  local_b8[9] = 0;
  local_b8[6] = 0;
  local_b8[7] = 0;
  local_b8[4] = 0;
  local_b8[5] = 0;
  local_b8[2] = 0;
  local_b8[3] = 0;
  local_b8[0] = 0;
  local_b8[1] = 0;
  local_138.fds_bits[0] = 0;
  local_138.fds_bits[1] = 0;
  local_138.fds_bits[2] = 0;
  local_138.fds_bits[3] = 0;
  local_138.fds_bits[4] = 0;
  local_138.fds_bits[5] = 0;
  local_138.fds_bits[6] = 0;
  local_138.fds_bits[7] = 0;
  local_138.fds_bits[8] = 0;
  local_138.fds_bits[9] = 0;
  local_138.fds_bits[10] = 0;
  local_138.fds_bits[0xb] = 0;
  local_138.fds_bits[0xc] = 0;
  local_138.fds_bits[0xd] = 0;
  local_138.fds_bits[0xe] = 0;
  local_138.fds_bits[0xf] = 0;
  iVar20 = this->breakPipe_[0];
  iVar6 = iVar20 + 0x3f;
  if (-1 < iVar20) {
    iVar6 = iVar20;
  }
  local_b8[iVar6 >> 6] = local_b8[iVar6 >> 6] | 1L << ((byte)iVar20 & 0x3f);
  ppVar10 = (this->socketListeners_).
            super__Vector_base<std::pair<PacketListener_*,_UdpSocket_*>,_std::allocator<std::pair<PacketListener_*,_UdpSocket_*>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar8 = (this->socketListeners_).
                super__Vector_base<std::pair<PacketListener_*,_UdpSocket_*>,_std::allocator<std::pair<PacketListener_*,_UdpSocket_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar8 != ppVar10; ppVar8 = ppVar8 + 1) {
    iVar6 = ppVar8->second->impl_->socket_;
    if (iVar20 <= iVar6) {
      iVar20 = iVar6;
    }
    iVar15 = iVar6 + 0x3f;
    if (-1 < iVar6) {
      iVar15 = iVar6;
    }
    local_b8[iVar15 >> 6] = local_b8[iVar15 >> 6] | 1L << ((byte)iVar6 & 0x3f);
  }
  gettimeofday(&local_198,(__timezone_ptr_t)0x0);
  dVar22 = (double)local_198.tv_sec;
  dVar2 = (double)local_198.tv_usec;
  local_198.tv_sec = 0;
  local_198.tv_usec = 0;
  local_188 = (pair<double,_AttachedTimerListener> *)0x0;
  pAVar19 = (this->timerListeners_).
            super__Vector_base<AttachedTimerListener,_std::allocator<AttachedTimerListener>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (pAVar19 !=
      (this->timerListeners_).
      super__Vector_base<AttachedTimerListener,_std::allocator<AttachedTimerListener>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_178 = dVar22 * 1000.0 + dVar2 / 1000.0;
    do {
      local_170.first = (double)pAVar19->initialDelayMs + local_178;
      local_170.second.initialDelayMs = pAVar19->initialDelayMs;
      local_170.second.periodMs = pAVar19->periodMs;
      local_170.second.listener = pAVar19->listener;
      if ((pair<double,_AttachedTimerListener> *)local_198.tv_usec == local_188) {
        std::
        vector<std::pair<double,AttachedTimerListener>,std::allocator<std::pair<double,AttachedTimerListener>>>
        ::_M_realloc_insert<std::pair<double,AttachedTimerListener>>
                  ((vector<std::pair<double,AttachedTimerListener>,std::allocator<std::pair<double,AttachedTimerListener>>>
                    *)&local_198,(iterator)local_198.tv_usec,&local_170);
      }
      else {
        ((AttachedTimerListener *)(local_198.tv_usec + 8))->listener = local_170.second.listener;
        *(double *)local_198.tv_usec = local_170.first;
        ((AttachedTimerListener *)(local_198.tv_usec + 8))->initialDelayMs =
             local_170.second.initialDelayMs;
        ((AttachedTimerListener *)(local_198.tv_usec + 8))->periodMs = local_170.second.periodMs;
        local_198.tv_usec = local_198.tv_usec + 0x18;
      }
      _Var5 = local_198.tv_usec;
      _Var4 = local_198.tv_sec;
      pAVar19 = pAVar19 + 1;
    } while (pAVar19 !=
             (this->timerListeners_).
             super__Vector_base<AttachedTimerListener,_std::allocator<AttachedTimerListener>_>.
             _M_impl.super__Vector_impl_data._M_finish);
    if (local_198.tv_sec != local_198.tv_usec) {
      uVar12 = (local_198.tv_usec - local_198.tv_sec >> 3) * -0x5555555555555555;
      lVar13 = 0x3f;
      if (uVar12 != 0) {
        for (; uVar12 >> lVar13 == 0; lVar13 = lVar13 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<double,AttachedTimerListener>*,std::vector<std::pair<double,AttachedTimerListener>,std::allocator<std::pair<double,AttachedTimerListener>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::pair<double,AttachedTimerListener>const&,std::pair<double,AttachedTimerListener>const&)>>
                ((__normal_iterator<std::pair<double,_AttachedTimerListener>_*,_std::vector<std::pair<double,_AttachedTimerListener>,_std::allocator<std::pair<double,_AttachedTimerListener>_>_>_>
                  )local_198.tv_sec,
                 (__normal_iterator<std::pair<double,_AttachedTimerListener>_*,_std::vector<std::pair<double,_AttachedTimerListener>,_std::allocator<std::pair<double,_AttachedTimerListener>_>_>_>
                  )local_198.tv_usec,(ulong)(((uint)lVar13 ^ 0x3f) * 2) ^ 0x7e,
                 (_Iter_comp_iter<bool_(*)(const_std::pair<double,_AttachedTimerListener>_&,_const_std::pair<double,_AttachedTimerListener>_&)>
                  )0x104412);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<double,AttachedTimerListener>*,std::vector<std::pair<double,AttachedTimerListener>,std::allocator<std::pair<double,AttachedTimerListener>>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::pair<double,AttachedTimerListener>const&,std::pair<double,AttachedTimerListener>const&)>>
                ((__normal_iterator<std::pair<double,_AttachedTimerListener>_*,_std::vector<std::pair<double,_AttachedTimerListener>,_std::allocator<std::pair<double,_AttachedTimerListener>_>_>_>
                  )_Var4,(__normal_iterator<std::pair<double,_AttachedTimerListener>_*,_std::vector<std::pair<double,_AttachedTimerListener>,_std::allocator<std::pair<double,_AttachedTimerListener>_>_>_>
                          )_Var5,
                 (_Iter_comp_iter<bool_(*)(const_std::pair<double,_AttachedTimerListener>_&,_const_std::pair<double,_AttachedTimerListener>_&)>
                  )0x104412);
    }
  }
  data = (char *)operator_new__(0x1002);
  local_148.address = 0xffffffff;
  local_148.port = -1;
  if (this->break_ == false) {
    do {
      puVar16 = local_b8;
      pfVar17 = &local_138;
      for (lVar13 = 0x10; lVar13 != 0; lVar13 = lVar13 + -1) {
        pfVar17->fds_bits[0] = *puVar16;
        puVar16 = puVar16 + (ulong)bVar21 * -2 + 1;
        pfVar17 = (fd_set *)((long)pfVar17 + ((ulong)bVar21 * -2 + 1) * 8);
      }
      if (local_198.tv_sec == local_198.tv_usec) {
        __timeout = (timeval *)0x0;
      }
      else {
        local_178 = *(double *)local_198.tv_sec;
        gettimeofday((timeval *)&local_170,(__timezone_ptr_t)0x0);
        dVar2 = local_178 -
                ((double)(long)local_170.first * 1000.0 +
                (double)(long)local_170.second._0_8_ / 1000.0);
        dVar22 = 0.0;
        if (0.0 <= dVar2) {
          dVar22 = dVar2;
        }
        local_158.tv_sec = (__time_t)(dVar22 * 0.001);
        local_158.tv_usec = (__suseconds_t)((dVar22 - (double)(local_158.tv_sec * 1000)) * 1000.0);
        __timeout = &local_158;
      }
      iVar6 = select(iVar20 + 1,&local_138,(fd_set *)0x0,(fd_set *)0x0,__timeout);
      if (iVar6 < 0) {
        if (this->break_ != false) break;
        piVar11 = __errno_location();
        if (*piVar11 != 4) {
          this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_01,"select failed\n");
          __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
      }
      else {
        uVar1 = this->breakPipe_[0];
        uVar7 = uVar1 + 0x3f;
        if (-1 < (int)uVar1) {
          uVar7 = uVar1;
        }
        if (((ulong)local_138.fds_bits[(int)uVar7 >> 6] >> ((ulong)uVar1 & 0x3f) & 1) != 0) {
          read(uVar1,&local_170,1);
        }
        if (this->break_ != false) break;
        ppVar10 = (this->socketListeners_).
                  super__Vector_base<std::pair<PacketListener_*,_UdpSocket_*>,_std::allocator<std::pair<PacketListener_*,_UdpSocket_*>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        for (ppVar8 = (this->socketListeners_).
                      super__Vector_base<std::pair<PacketListener_*,_UdpSocket_*>,_std::allocator<std::pair<PacketListener_*,_UdpSocket_*>_>_>
                      ._M_impl.super__Vector_impl_data._M_start; ppVar8 != ppVar10;
            ppVar8 = ppVar8 + 1) {
          this_00 = ppVar8->second->impl_;
          uVar1 = this_00->socket_;
          uVar7 = uVar1 + 0x3f;
          if (-1 < (int)uVar1) {
            uVar7 = uVar1;
          }
          if (((ulong)local_138.fds_bits[(int)uVar7 >> 6] >> ((ulong)uVar1 & 0x3f) & 1) != 0) {
            sVar9 = UdpSocket::Implementation::ReceiveFrom(this_00,&local_148,data,0x1002);
            if (sVar9 == 0) {
              ppVar10 = (this->socketListeners_).
                        super__Vector_base<std::pair<PacketListener_*,_UdpSocket_*>,_std::allocator<std::pair<PacketListener_*,_UdpSocket_*>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            }
            else {
              (*ppVar8->first->_vptr_PacketListener[2])
                        (ppVar8->first,data,sVar9 & 0xffffffff,&local_148);
              ppVar10 = (this->socketListeners_).
                        super__Vector_base<std::pair<PacketListener_*,_UdpSocket_*>,_std::allocator<std::pair<PacketListener_*,_UdpSocket_*>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              if (this->break_ != false) break;
            }
          }
        }
        gettimeofday((timeval *)&local_170,(__timezone_ptr_t)0x0);
        if ((local_198.tv_sec != local_198.tv_usec) &&
           (local_178 = (double)(long)local_170.first * 1000.0 +
                        (double)(long)local_170.second._0_8_ / 1000.0,
           *(double *)local_198.tv_sec <= local_178)) {
          bVar14 = false;
          ppVar3 = (pair<double,_AttachedTimerListener> *)local_198.tv_sec;
          while( true ) {
            ppVar18 = ppVar3 + 1;
            (**(code **)(*(long *)(ppVar3->second).listener + 0x10))();
            _Var5 = local_198.tv_usec;
            _Var4 = local_198.tv_sec;
            if (this->break_ != false) break;
            ppVar3->first = (double)(ppVar3->second).periodMs + ppVar3->first;
            if ((ppVar18 == (pair<double,_AttachedTimerListener> *)local_198.tv_usec) ||
               (bVar14 = true, ppVar3 = ppVar18, local_178 < ppVar18->first)) goto LAB_00104ff0;
          }
          if (!bVar14) goto LAB_00105042;
LAB_00104ff0:
          if (local_198.tv_sec != local_198.tv_usec) {
            uVar12 = (local_198.tv_usec - local_198.tv_sec >> 3) * -0x5555555555555555;
            lVar13 = 0x3f;
            if (uVar12 != 0) {
              for (; uVar12 >> lVar13 == 0; lVar13 = lVar13 + -1) {
              }
            }
            std::
            __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<double,AttachedTimerListener>*,std::vector<std::pair<double,AttachedTimerListener>,std::allocator<std::pair<double,AttachedTimerListener>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::pair<double,AttachedTimerListener>const&,std::pair<double,AttachedTimerListener>const&)>>
                      ((__normal_iterator<std::pair<double,_AttachedTimerListener>_*,_std::vector<std::pair<double,_AttachedTimerListener>,_std::allocator<std::pair<double,_AttachedTimerListener>_>_>_>
                        )local_198.tv_sec,
                       (__normal_iterator<std::pair<double,_AttachedTimerListener>_*,_std::vector<std::pair<double,_AttachedTimerListener>,_std::allocator<std::pair<double,_AttachedTimerListener>_>_>_>
                        )local_198.tv_usec,(ulong)(((uint)lVar13 ^ 0x3f) * 2) ^ 0x7e,
                       (_Iter_comp_iter<bool_(*)(const_std::pair<double,_AttachedTimerListener>_&,_const_std::pair<double,_AttachedTimerListener>_&)>
                        )0x104412);
            std::
            __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<double,AttachedTimerListener>*,std::vector<std::pair<double,AttachedTimerListener>,std::allocator<std::pair<double,AttachedTimerListener>>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::pair<double,AttachedTimerListener>const&,std::pair<double,AttachedTimerListener>const&)>>
                      ((__normal_iterator<std::pair<double,_AttachedTimerListener>_*,_std::vector<std::pair<double,_AttachedTimerListener>,_std::allocator<std::pair<double,_AttachedTimerListener>_>_>_>
                        )_Var4,(__normal_iterator<std::pair<double,_AttachedTimerListener>_*,_std::vector<std::pair<double,_AttachedTimerListener>,_std::allocator<std::pair<double,_AttachedTimerListener>_>_>_>
                                )_Var5,
                       (_Iter_comp_iter<bool_(*)(const_std::pair<double,_AttachedTimerListener>_&,_const_std::pair<double,_AttachedTimerListener>_&)>
                        )0x104412);
          }
        }
      }
LAB_00105042:
    } while (this->break_ == false);
  }
  operator_delete__(data);
  if ((pair<double,_AttachedTimerListener> *)local_198.tv_sec !=
      (pair<double,_AttachedTimerListener> *)0x0) {
    operator_delete((void *)local_198.tv_sec,(long)local_188 - local_198.tv_sec);
  }
  return;
}

Assistant:

void Run()
	{
		break_ = false;
        char *data = 0;
        
        try{
            
            // configure the master fd_set for select()

            fd_set masterfds, tempfds;
            FD_ZERO( &masterfds );
            FD_ZERO( &tempfds );
            
            // in addition to listening to the inbound sockets we
            // also listen to the asynchronous break pipe, so that AsynchronousBreak()
            // can break us out of select() from another thread.
            FD_SET( breakPipe_[0], &masterfds );
            int fdmax = breakPipe_[0];		

            for( std::vector< std::pair< PacketListener*, UdpSocket* > >::iterator i = socketListeners_.begin();
                    i != socketListeners_.end(); ++i ){

                if( fdmax < i->second->impl_->Socket() )
                    fdmax = i->second->impl_->Socket();
                FD_SET( i->second->impl_->Socket(), &masterfds );
            }


            // configure the timer queue
            double currentTimeMs = GetCurrentTimeMs();

            // expiry time ms, listener
            std::vector< std::pair< double, AttachedTimerListener > > timerQueue_;
            for( std::vector< AttachedTimerListener >::iterator i = timerListeners_.begin();
                    i != timerListeners_.end(); ++i )
                timerQueue_.push_back( std::make_pair( currentTimeMs + i->initialDelayMs, *i ) );
            std::sort( timerQueue_.begin(), timerQueue_.end(), CompareScheduledTimerCalls );

            const int MAX_BUFFER_SIZE = 4098;
            data = new char[ MAX_BUFFER_SIZE ];
            IpEndpointName remoteEndpoint;

            struct timeval timeout;

            while( !break_ ){
                tempfds = masterfds;

                struct timeval *timeoutPtr = 0;
                if( !timerQueue_.empty() ){
                    double timeoutMs = timerQueue_.front().first - GetCurrentTimeMs();
                    if( timeoutMs < 0 )
                        timeoutMs = 0;
                
                    long timoutSecondsPart = (long)(timeoutMs * .001);
                    timeout.tv_sec = (time_t)timoutSecondsPart;
                    // 1000000 microseconds in a second
                    timeout.tv_usec = (suseconds_t)((timeoutMs - (timoutSecondsPart * 1000)) * 1000);
                    timeoutPtr = &timeout;
                }

                if( select( fdmax + 1, &tempfds, 0, 0, timeoutPtr ) < 0 ){
                    if( break_ ){
                        break;
                    }else if( errno == EINTR ){
                        // on returning an error, select() doesn't clear tempfds.
                        // so tempfds would remain all set, which would cause read( breakPipe_[0]...
                        // below to block indefinitely. therefore if select returns EINTR we restart
                        // the while() loop instead of continuing on to below.
                        continue;
                    }else{
                        throw std::runtime_error("select failed\n");
                    }
                }

                if( FD_ISSET( breakPipe_[0], &tempfds ) ){
                    // clear pending data from the asynchronous break pipe
                    char c;
                    read( breakPipe_[0], &c, 1 );
                }
                
                if( break_ )
                    break;

                for( std::vector< std::pair< PacketListener*, UdpSocket* > >::iterator i = socketListeners_.begin();
                        i != socketListeners_.end(); ++i ){

                    if( FD_ISSET( i->second->impl_->Socket(), &tempfds ) ){

                        std::size_t size = i->second->ReceiveFrom( remoteEndpoint, data, MAX_BUFFER_SIZE );
                        if( size > 0 ){
                            i->first->ProcessPacket( data, (int)size, remoteEndpoint );
                            if( break_ )
                                break;
                        }
                    }
                }

                // execute any expired timers
                currentTimeMs = GetCurrentTimeMs();
                bool resort = false;
                for( std::vector< std::pair< double, AttachedTimerListener > >::iterator i = timerQueue_.begin();
                        i != timerQueue_.end() && i->first <= currentTimeMs; ++i ){

                    i->second.listener->TimerExpired();
                    if( break_ )
                        break;

                    i->first += i->second.periodMs;
                    resort = true;
                }
                if( resort )
                    std::sort( timerQueue_.begin(), timerQueue_.end(), CompareScheduledTimerCalls );
            }

            delete [] data;
        }catch(...){
            if( data )
                delete [] data;
            throw;
        }
	}